

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

size_t enet_list_size(ENetList *list)

{
  ENetListIterator position;
  size_t size;
  ENetList *list_local;
  
  size = 0;
  for (position = (list->sentinel).next; position != &list->sentinel; position = position->next) {
    size = size + 1;
  }
  return size;
}

Assistant:

size_t
enet_list_size (ENetList * list)
{
   size_t size = 0;
   ENetListIterator position;

   for (position = enet_list_begin (list);
        position != enet_list_end (list);
        position = enet_list_next (position))
     ++ size;
   
   return size;
}